

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::Discreet3DSImporter::CanRead
          (Discreet3DSImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  uint16_t token [3];
  string extension;
  undefined4 local_4e;
  string local_48;
  
  BaseImporter::GetExtension(&local_48,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  bVar1 = true;
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar2 != 0) {
      if (local_48._M_string_length == 0 || checkSig) {
        local_4e = 0x3dc24d4d;
        bVar1 = BaseImporter::CheckMagicToken(pIOHandler,pFile,&local_4e,2,0,2);
      }
      else {
        bVar1 = false;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool Discreet3DSImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const {
    std::string extension = GetExtension(pFile);
	if(extension == "3ds" || extension == "prj") {
        return true;
    }

    if (!extension.length() || checkSig) {
        uint16_t token[3];
        token[0] = 0x4d4d;
        token[1] = 0x3dc2;
        //token[2] = 0x3daa;
        return CheckMagicToken(pIOHandler,pFile,token,2,0,2);
    }
    return false;
}